

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

Value * duckdb::Value::MAP(Value *__return_storage_ptr__,
                          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *kv_pairs)

{
  shared_ptr<duckdb::ExtraTypeInfo,_true> *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar2;
  Value *pVVar3;
  _func_int **pp_Var4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 this_00;
  undefined4 uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  _Hash_node_base *p_Var10;
  Value *pVVar11;
  Value *pVVar12;
  ExtraValueInfo *__tmp;
  long lVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>
  __l;
  allocator_type local_279;
  undefined8 local_278;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  Value *local_268;
  Value *pVStack_260;
  _func_int **local_258;
  string local_250;
  string local_230;
  LogicalType local_210;
  LogicalType local_1f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  local_1e0;
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  Value local_160;
  LogicalType local_120;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_108;
  Value local_f0;
  Value local_b0;
  Value local_70;
  
  LogicalType::LogicalType(&local_120,SQLNULL);
  Value(__return_storage_ptr__,&local_120);
  LogicalType::~LogicalType(&local_120);
  LogicalType::LogicalType(&local_1f8,VARCHAR);
  LogicalType::LogicalType(&local_210,VARCHAR);
  LogicalType::MAP((LogicalType *)&local_1e0,&local_1f8,&local_210);
  (__return_storage_ptr__->type_).id_ = (LogicalTypeId)local_1e0.first._M_dataplus._M_p;
  (__return_storage_ptr__->type_).physical_type_ = local_1e0.first._M_dataplus._M_p._1_1_;
  psVar1 = &(__return_storage_ptr__->type_).type_info_;
  uVar14 = *(undefined4 *)
            &(psVar1->internal).
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar15 = *(undefined4 *)
            ((long)&(__return_storage_ptr__->type_).type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4
            );
  peVar2 = (psVar1->internal).super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  uVar16 = *(undefined4 *)
            &(__return_storage_ptr__->type_).type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  uVar17 = *(undefined4 *)
            ((long)&(__return_storage_ptr__->type_).type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 4);
  (__return_storage_ptr__->type_).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (__return_storage_ptr__->type_).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar5 = (undefined4)local_1e0.first._M_string_length;
  uVar6 = local_1e0.first._M_string_length._4_4_;
  uVar7 = local_1e0.first.field_2._M_allocated_capacity._0_4_;
  uVar8 = local_1e0.first.field_2._M_allocated_capacity._4_4_;
  local_1e0.first._M_string_length = 0;
  local_1e0.first.field_2._M_allocated_capacity = 0;
  p_Var9 = (__return_storage_ptr__->type_).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  *(undefined4 *)
   &(__return_storage_ptr__->type_).type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = uVar5;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->type_).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = uVar6
  ;
  *(undefined4 *)
   &(__return_storage_ptr__->type_).type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = uVar7;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->type_).type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
   4) = uVar8;
  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_278 = (Value *)peVar2;
    uStack_270 = uVar16;
    uStack_26c = uVar17;
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
    uVar14 = (undefined4)local_278;
    uVar15 = local_278._4_4_;
    uVar16 = uStack_270;
    uVar17 = uStack_26c;
  }
  this_00 = local_1e0.first.field_2._M_allocated_capacity;
  local_1e0.first._M_string_length = CONCAT44(uVar15,uVar14);
  local_1e0.first.field_2._M_allocated_capacity._4_4_ = uVar17;
  local_1e0.first.field_2._M_allocated_capacity._0_4_ = uVar16;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  LogicalType::~LogicalType((LogicalType *)&local_1e0);
  LogicalType::~LogicalType(&local_210);
  LogicalType::~LogicalType(&local_1f8);
  __return_storage_ptr__->is_null = false;
  local_268 = (Value *)0x0;
  pVStack_260 = (Value *)0x0;
  local_258 = (_func_int **)0x0;
  p_Var10 = (kv_pairs->_M_h)._M_before_begin._M_nxt;
  local_278 = __return_storage_ptr__;
  if (p_Var10 != (_Hash_node_base *)0x0) {
    do {
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,p_Var10[1]._M_nxt,
                 (long)&(p_Var10[1]._M_nxt)->_M_nxt + (long)&(p_Var10[2]._M_nxt)->_M_nxt);
      Value(&local_b0,&local_230);
      local_1e0.first._M_dataplus._M_p = (pointer)&local_1e0.first.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"key","");
      Value(&local_1e0.second,&local_b0);
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,p_Var10[5]._M_nxt,
                 (long)&(p_Var10[5]._M_nxt)->_M_nxt + (long)&(p_Var10[6]._M_nxt)->_M_nxt);
      Value(&local_f0,&local_250);
      local_180[0] = local_170;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"value","");
      Value(&local_160,&local_f0);
      __l._M_len = 2;
      __l._M_array = &local_1e0;
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::vector(&local_108,__l,&local_279);
      STRUCT(&local_70,(child_list_t<Value> *)&local_108);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_268,&local_70);
      ~Value(&local_70);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::~vector(&local_108);
      lVar13 = -0xc0;
      pVVar12 = &local_160;
      do {
        ~Value(pVVar12);
        if (&pVVar12[-1].value_info_ !=
            (shared_ptr<duckdb::ExtraValueInfo,_true> *)pVVar12[-1].value_.bigint) {
          operator_delete((undefined1 *)pVVar12[-1].value_.bigint);
        }
        pVVar12 = (Value *)&pVVar12[-2].value_;
        lVar13 = lVar13 + 0x60;
      } while (lVar13 != 0);
      ~Value(&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p);
      }
      ~Value(&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      p_Var10 = p_Var10->_M_nxt;
    } while (p_Var10 != (_Hash_node_base *)0x0);
  }
  p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  pp_Var4 = local_258;
  pVVar11 = pVStack_260;
  pVVar3 = local_268;
  pVVar12 = local_278;
  p_Var9->_M_use_count = 1;
  p_Var9->_M_weak_count = 1;
  p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_01997b30;
  local_268 = (Value *)0x0;
  pVStack_260 = (Value *)0x0;
  local_258 = (_func_int **)0x0;
  *(undefined1 *)&p_Var9[1]._M_use_count = 2;
  p_Var9[1]._vptr__Sp_counted_base = (_func_int **)&PTR__NestedValueInfo_01997b80;
  p_Var9[2]._vptr__Sp_counted_base = (_func_int **)pVVar3;
  *(Value **)&p_Var9[2]._M_use_count = pVVar11;
  p_Var9[3]._vptr__Sp_counted_base = pp_Var4;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var9->_M_use_count = 2;
  }
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
  (pVVar12->value_info_).internal.
  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var9 + 1);
  this = (pVVar12->value_info_).internal.
         super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pVVar12->value_info_).internal.
  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var9;
  pVVar11 = local_268;
  pVVar3 = pVStack_260;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    pVVar11 = local_268;
    pVVar3 = pVStack_260;
  }
  for (; pVVar11 != pVVar3; pVVar11 = pVVar11 + 1) {
    ~Value(pVVar11);
  }
  if (local_268 != (Value *)0x0) {
    operator_delete(local_268);
  }
  return pVVar12;
}

Assistant:

Value Value::MAP(const unordered_map<string, string> &kv_pairs) {
	Value result;
	result.type_ = LogicalType::MAP(LogicalType::VARCHAR, LogicalType::VARCHAR);
	result.is_null = false;
	vector<Value> pairs;
	for (auto &kv : kv_pairs) {
		pairs.push_back(Value::STRUCT({{"key", Value(kv.first)}, {"value", Value(kv.second)}}));
	}
	result.value_info_ = make_shared_ptr<NestedValueInfo>(std::move(pairs));
	return result;
}